

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O2

void __thiscall klogic::mlmvn::get_stats(mlmvn *this,size_t *n_weights,size_t *n_neurons)

{
  pointer pvVar1;
  pointer pvVar2;
  ulong uVar3;
  size_t sVar4;
  pointer *ppmVar5;
  size_t sVar6;
  
  *n_weights = 0;
  *n_neurons = 0;
  pvVar1 = (this->neurons).
           super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->neurons).
           super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppmVar5 = (pointer *)
            ((long)&(pvVar1->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>)._M_impl
            + 8);
  sVar6 = this->input_size;
  for (uVar3 = 0; uVar3 < (ulong)(((long)pvVar2 - (long)pvVar1) / 0x18); uVar3 = uVar3 + 1) {
    sVar4 = (long)*ppmVar5 - (long)((_Vector_impl_data *)(ppmVar5 + -1))->_M_start >> 5;
    *n_weights = *n_weights + (sVar6 + 1) * sVar4;
    *n_neurons = *n_neurons + sVar4;
    ppmVar5 = ppmVar5 + 3;
    sVar6 = sVar4;
  }
  return;
}

Assistant:

void klogic::mlmvn::get_stats(size_t &n_weights, size_t &n_neurons) const
{
    n_weights = 0, n_neurons = 0;

    size_t prev_layer_size = input_size;

    for (int layer = 0; layer < layers_count(); ++layer) {
        size_t layer_size = neurons[layer].size();

        n_weights += layer_size * (prev_layer_size + 1);
        n_neurons += layer_size;

        prev_layer_size = layer_size;
    }
}